

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host.c
# Opt level: O0

axbStatus_t op_vec_min(axbVec_s *x,size_t *idx,axbScalar_s *m,void *aux_data)

{
  size_t *psVar1;
  size_t *psVar2;
  ulong local_48;
  size_t i;
  double cur_min;
  double *d_min;
  double *d_x;
  void *aux_data_local;
  axbScalar_s *m_local;
  size_t *idx_local;
  axbVec_s *x_local;
  
  psVar1 = (size_t *)x->data;
  psVar2 = (size_t *)m->data;
  i = *psVar1;
  *idx = 0;
  for (local_48 = 1; local_48 < x->size; local_48 = local_48 + 1) {
    if ((double)psVar1[local_48] < (double)i) {
      i = psVar1[local_48];
      *idx = local_48;
    }
  }
  *psVar2 = i;
  return 0;
}

Assistant:

static axbStatus_t op_vec_min(const struct axbVec_s *x, size_t *idx, struct axbScalar_s *m, void *aux_data)
{
  (void)aux_data;

  const double *d_x   = (const double*)x->data;
        double *d_min =       (double*)m->data;

  double cur_min = d_x[0];
  *idx = 0;
  for (size_t i=1; i<x->size; ++i) {
    if (d_x[i] < cur_min) {
      cur_min = d_x[i];
      *idx = i;
    }
  }
  *d_min = cur_min;

  return 0;
}